

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_format.hpp
# Opt level: O1

string_t *
cfgfile::from_cfgfile_format<cfgfile::qstring_trait_t>
          (string_t *__return_storage_ptr__,string_t *what)

{
  ushort uVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  logic_error *plVar8;
  string local_108;
  string_t local_e8;
  qstring_wrapper_t local_c8;
  string_t local_b0;
  QString local_98;
  string_t local_80;
  qstring_wrapper_t local_68;
  string local_50;
  
  iVar7 = QString::indexOf((QChar)(char16_t)what,(ulong)const_t<cfgfile::qstring_trait_t>::c_quotes,
                           CaseInsensitive);
  if ((iVar7 == 0) &&
     (iVar7 = QString::lastIndexOf
                        ((QChar)(char16_t)what,(ulong)const_t<cfgfile::qstring_trait_t>::c_quotes,
                         ~CaseInsensitive), (int)(what->m_str).d.size + -1 == iVar7)) {
    QString::mid((longlong)&local_108,(longlong)what);
    if ((QArrayData *)local_108._M_dataplus._M_p != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_108._M_dataplus._M_p = *(int *)local_108._M_dataplus._M_p + 1;
      UNLOCK();
      LOCK();
      *(int *)local_108._M_dataplus._M_p = *(int *)local_108._M_dataplus._M_p + -1;
      UNLOCK();
      if (*(int *)local_108._M_dataplus._M_p == 0) {
        QArrayData::deallocate((QArrayData *)local_108._M_dataplus._M_p,2,8);
      }
    }
    (__return_storage_ptr__->m_str).d.d = (Data *)0x0;
    (__return_storage_ptr__->m_str).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->m_str).d.size = 0;
    if (0 < (int)local_108.field_2._M_allocated_capacity._0_4_) {
      iVar7 = 0;
      do {
        if (*(ushort *)(local_108._M_string_length + (long)iVar7 * 2) ==
            const_t<cfgfile::qstring_trait_t>::c_back_slash) {
          iVar7 = iVar7 + 1;
          if ((int)local_108.field_2._M_allocated_capacity._0_4_ <= iVar7) {
            plVar8 = (logic_error *)__cxa_allocate_exception(0x28);
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_108,"Unfinished backslash sequence \"\\\".","");
            qstring_trait_t::from_ascii(&local_e8,&local_108);
            std::logic_error::logic_error(plVar8,"Please use desc() method of the exception.");
            *(undefined ***)plVar8 = &PTR__exception_t_00122a28;
            *(undefined8 *)(plVar8 + 0x10) = 0;
            *(undefined8 *)(plVar8 + 0x18) = 0;
            *(undefined8 *)(plVar8 + 0x20) = 0;
            pcVar2 = *(char16_t **)(plVar8 + 0x18);
            uVar5 = local_e8.m_str.d.d._0_4_;
            uVar6 = local_e8.m_str.d.d._4_4_;
            local_e8.m_str.d.d = (Data *)0x0;
            *(undefined4 *)(plVar8 + 0x10) = uVar5;
            *(undefined4 *)(plVar8 + 0x14) = uVar6;
            *(undefined4 *)(plVar8 + 0x18) = local_e8.m_str.d.ptr._0_4_;
            *(undefined4 *)(plVar8 + 0x1c) = local_e8.m_str.d.ptr._4_4_;
            qVar3 = *(qsizetype *)(plVar8 + 0x20);
            *(qsizetype *)(plVar8 + 0x20) = local_e8.m_str.d.size;
            local_e8.m_str.d.ptr = pcVar2;
            local_e8.m_str.d.size = qVar3;
            __cxa_throw(plVar8,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                        exception_t<cfgfile::qstring_trait_t>::~exception_t);
          }
          uVar1 = *(ushort *)(local_108._M_string_length + (long)iVar7 * 2);
          if ((((uVar1 != const_t<cfgfile::qstring_trait_t>::c_quotes) &&
               (uVar1 != const_t<cfgfile::qstring_trait_t>::c_n)) &&
              (uVar1 != const_t<cfgfile::qstring_trait_t>::c_r)) &&
             ((uVar1 != const_t<cfgfile::qstring_trait_t>::c_t &&
              (uVar1 != const_t<cfgfile::qstring_trait_t>::c_back_slash)))) {
            plVar8 = (logic_error *)
                     __cxa_allocate_exception(0x28,const_t<cfgfile::qstring_trait_t>::c_back_slash);
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_108,"Unrecognized backslash sequence \"\\","");
            qstring_trait_t::from_ascii(&local_80,&local_108);
            QString::QString(&local_98,1,
                             (QChar)*(char16_t *)(local_108._M_string_length + (long)iVar7 * 2));
            operator+(&local_68,&local_80,(qstring_wrapper_t *)&local_98);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\".","");
            qstring_trait_t::from_ascii(&local_b0,&local_50);
            operator+(&local_c8,&local_68,&local_b0);
            std::logic_error::logic_error(plVar8,"Please use desc() method of the exception.");
            *(undefined ***)plVar8 = &PTR__exception_t_00122a28;
            *(undefined8 *)(plVar8 + 0x10) = 0;
            *(undefined8 *)(plVar8 + 0x18) = 0;
            *(undefined8 *)(plVar8 + 0x20) = 0;
            pcVar2 = *(char16_t **)(plVar8 + 0x18);
            uVar5 = local_c8.m_str.d.d._0_4_;
            uVar6 = local_c8.m_str.d.d._4_4_;
            local_c8.m_str.d.d = (Data *)0x0;
            *(undefined4 *)(plVar8 + 0x10) = uVar5;
            *(undefined4 *)(plVar8 + 0x14) = uVar6;
            *(undefined4 *)(plVar8 + 0x18) = local_c8.m_str.d.ptr._0_4_;
            *(undefined4 *)(plVar8 + 0x1c) = local_c8.m_str.d.ptr._4_4_;
            qVar3 = *(qsizetype *)(plVar8 + 0x20);
            *(qsizetype *)(plVar8 + 0x20) = local_c8.m_str.d.size;
            local_c8.m_str.d.ptr = pcVar2;
            local_c8.m_str.d.size = qVar3;
            __cxa_throw(plVar8,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                        exception_t<cfgfile::qstring_trait_t>::~exception_t);
          }
          QString::append((QChar)(char16_t)__return_storage_ptr__);
        }
        else {
          QString::append((QChar)(char16_t)__return_storage_ptr__);
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 < (int)local_108.field_2._M_allocated_capacity._0_4_);
    }
    if ((QArrayData *)local_108._M_dataplus._M_p != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_108._M_dataplus._M_p = *(int *)local_108._M_dataplus._M_p + -1;
      UNLOCK();
      if (*(int *)local_108._M_dataplus._M_p == 0) {
        QArrayData::deallocate((QArrayData *)local_108._M_dataplus._M_p,2,8);
      }
    }
  }
  else {
    pDVar4 = (what->m_str).d.d;
    (__return_storage_ptr__->m_str).d.d = pDVar4;
    (__return_storage_ptr__->m_str).d.ptr = (what->m_str).d.ptr;
    (__return_storage_ptr__->m_str).d.size = (what->m_str).d.size;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
      UNLOCK();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static inline typename Trait::string_t from_cfgfile_format(
	const typename Trait::string_t & what )
{
	if( what.find( const_t< Trait >::c_quotes ) == 0 &&
		what.rfind( const_t< Trait >::c_quotes ) == what.length() - 1 )
	{
		typename Trait::string_t tmp = what.substr( 1, what.length() - 2 );

		typename Trait::string_t result;

		for( typename Trait::string_t::size_type i = 0; i < tmp.length(); ++i )
		{
			if( tmp.at( i ) == const_t< Trait >::c_back_slash )
			{
				if( i + 1 < tmp.length() )
				{
					if( tmp.at( i + 1 ) == const_t< Trait >::c_quotes )
						result.push_back( const_t< Trait >::c_quotes );
					else if( tmp.at( i + 1 ) == const_t< Trait >::c_n )
						result.push_back( const_t< Trait >::c_carriage_return );
					else if( tmp.at( i + 1 ) == const_t< Trait >::c_r )
						result.push_back( const_t< Trait >::c_line_feed );
					else if( tmp.at( i + 1 ) == const_t< Trait >::c_t )
						result.push_back( const_t< Trait >::c_tab );
					else if( tmp.at( i + 1 ) == const_t< Trait >::c_back_slash )
						result.push_back( const_t< Trait >::c_back_slash );
					else
						throw exception_t< Trait > ( Trait::from_ascii(
								"Unrecognized backslash sequence \"\\" ) +
							typename Trait::string_t( 1, tmp.at( i + 1 ) ) +
							Trait::from_ascii( "\"." ) );

					++i;
				}
				else
					throw exception_t< Trait > ( Trait::from_ascii(
						"Unfinished backslash sequence \"\\\"." ) );
			}
			else
				result.push_back( tmp.at( i ) );
		}

		return result;
	}
	else
		return what;
}